

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_rlwnm(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  TCGv_i64 arg1_00;
  uint32_t uVar1;
  uint32_t uVar2;
  target_ulong arg2;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  TCGv_i64 ret_02;
  TCGv_i64 t0_1;
  TCGv_i32 t1;
  TCGv_i32 t0;
  target_ulong mask;
  uint32_t me;
  uint32_t mb;
  TCGv_i64 t_rb;
  TCGv_i64 t_rs;
  TCGv_i64 t_ra;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = rA(ctx->opcode);
  ret = cpu_gpr[uVar1];
  uVar1 = rS(ctx->opcode);
  arg1 = cpu_gpr[uVar1];
  uVar1 = rB(ctx->opcode);
  arg1_00 = cpu_gpr[uVar1];
  uVar1 = MB(ctx->opcode);
  uVar2 = ME(ctx->opcode);
  arg2 = MASK((ulong)(uVar1 + 0x20),(ulong)(uVar2 + 0x20));
  if (arg2 < 0x100000000) {
    ret_00 = tcg_temp_new_i32(tcg_ctx_00);
    ret_01 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,ret_00,arg1_00);
    tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,ret_01,arg1);
    tcg_gen_andi_i32_ppc64(tcg_ctx_00,ret_00,ret_00,0x1f);
    tcg_gen_rotl_i32_ppc64(tcg_ctx_00,ret_01,ret_01,ret_00);
    tcg_gen_extu_i32_i64_ppc64(tcg_ctx_00,ret,ret_01);
    tcg_temp_free_i32(tcg_ctx_00,ret_00);
    tcg_temp_free_i32(tcg_ctx_00,ret_01);
  }
  else {
    ret_02 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret_02,arg1_00,0x1f);
    tcg_gen_deposit_i64_ppc64(tcg_ctx_00,ret,arg1,arg1,0x20,0x20);
    tcg_gen_rotl_i64_ppc64(tcg_ctx_00,ret,ret,ret_02);
    tcg_temp_free_i64(tcg_ctx_00,ret_02);
  }
  tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret,ret,arg2);
  uVar1 = Rc(ctx->opcode);
  if (uVar1 != 0) {
    gen_set_Rc0(ctx,ret);
  }
  return;
}

Assistant:

static void gen_rlwnm(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t_ra = cpu_gpr[rA(ctx->opcode)];
    TCGv t_rs = cpu_gpr[rS(ctx->opcode)];
    TCGv t_rb = cpu_gpr[rB(ctx->opcode)];
    uint32_t mb = MB(ctx->opcode);
    uint32_t me = ME(ctx->opcode);
    target_ulong mask;

#if defined(TARGET_PPC64)
    mb += 32;
    me += 32;
#endif
    mask = MASK(mb, me);

    if (mask <= 0xffffffffu) {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_trunc_tl_i32(tcg_ctx, t0, t_rb);
        tcg_gen_trunc_tl_i32(tcg_ctx, t1, t_rs);
        tcg_gen_andi_i32(tcg_ctx, t0, t0, 0x1f);
        tcg_gen_rotl_i32(tcg_ctx, t1, t1, t0);
        tcg_gen_extu_i32_tl(tcg_ctx, t_ra, t1);
        tcg_temp_free_i32(tcg_ctx, t0);
        tcg_temp_free_i32(tcg_ctx, t1);
    } else {
#if defined(TARGET_PPC64)
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_andi_i64(tcg_ctx, t0, t_rb, 0x1f);
        tcg_gen_deposit_i64(tcg_ctx, t_ra, t_rs, t_rs, 32, 32);
        tcg_gen_rotl_i64(tcg_ctx, t_ra, t_ra, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
#else
        g_assert_not_reached();
#endif
    }

    tcg_gen_andi_tl(tcg_ctx, t_ra, t_ra, mask);

    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t_ra);
    }
}